

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O2

QString * __thiscall
QTemporaryDir::filePath(QString *__return_storage_ptr__,QTemporaryDir *this,QString *fileName)

{
  QTemporaryDirPrivate *other;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_58;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QDir::isAbsolutePath(fileName);
  if (bVar1) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QString::toUtf8_helper((QByteArray *)&QStack_58,fileName);
    if (QStack_58.ptr == (char *)0x0) {
      QStack_58.ptr = &QByteArray::_empty;
    }
    QMessageLogger::warning
              (&local_40,"QTemporaryDir::filePath: Absolute paths are not allowed: %s",QStack_58.ptr
              );
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    other = this->d_ptr;
    if (other->success == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_0023d137;
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)other);
    if ((fileName->d).size != 0) {
      QString::append(__return_storage_ptr__,(QChar)0x2f);
      QString::append(__return_storage_ptr__,fileName);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_0023d137:
  __stack_chk_fail();
}

Assistant:

QString QTemporaryDir::filePath(const QString &fileName) const
{
    if (QDir::isAbsolutePath(fileName)) {
        qWarning("QTemporaryDir::filePath: Absolute paths are not allowed: %s", qUtf8Printable(fileName));
        return QString();
    }

    if (!d_ptr->success)
        return QString();

    QString ret = d_ptr->pathOrError;
    if (!fileName.isEmpty()) {
        ret += u'/';
        ret += fileName;
    }
    return ret;
}